

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenStructGet(BinaryenModuleRef module,BinaryenIndex index,BinaryenExpressionRef ref,
                 BinaryenType type,bool signed_)

{
  StructGet *this;
  
  this = (StructGet *)MixedArena::allocSpace(&module->allocator,0x28,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id = StructGetId;
  this->order = Unordered;
  this->index = index;
  this->ref = ref;
  (this->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id = type;
  this->signed_ = signed_;
  wasm::StructGet::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenStructGet(BinaryenModuleRef module,
                                        BinaryenIndex index,
                                        BinaryenExpressionRef ref,
                                        BinaryenType type,
                                        bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStructGet(
        index, (Expression*)ref, MemoryOrder::Unordered, Type(type), signed_));
}